

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> * __thiscall
kj::ArrayBuilder<const_void_*>::operator=
          (ArrayBuilder<const_void_*> *this,
          ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *pRVar4;
  ArrayDisposer *pAVar5;
  
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)(this + 0x10);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    (**(code **)**(undefined8 **)(this + 0x18))
              (*(undefined8 **)(this + 0x18),lVar1,8,lVar2 - lVar1 >> 3,lVar3 - lVar1 >> 3,0);
  }
  pRVar4 = other->pos;
  *(Entry **)this = other->ptr;
  *(RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> **)(this + 8) =
       pRVar4;
  pAVar5 = other->disposer;
  *(Entry **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = pAVar5;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }